

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DMAController.cpp
# Opt level: O0

void __thiscall Atari::ST::DMAController::DMAController(DMAController *this)

{
  Buffer *local_28;
  DMAController *this_local;
  
  WD::WD1770::Delegate::Delegate(&this->super_Delegate);
  ClockingHint::Source::Source(&this->super_Source);
  ClockingHint::Observer::Observer(&this->super_Observer);
  (this->super_Delegate)._vptr_Delegate = (_func_int **)&PTR_wd1770_did_change_output_00c9de40;
  (this->super_Source)._vptr_Source = (_func_int **)&DAT_00c9de68;
  (this->super_Observer)._vptr_Observer = (_func_int **)&DAT_00c9de80;
  HalfCycles::HalfCycles(&this->running_time_);
  WD1772::WD1772(&this->fdc_);
  this->control_ = 0;
  this->delegate_ = (Delegate *)0x0;
  this->interrupt_line_ = false;
  this->bus_request_line_ = false;
  local_28 = this->buffer_;
  do {
    Buffer::Buffer(local_28);
    local_28 = local_28 + 1;
  } while (local_28 != (Buffer *)&this->active_buffer_);
  this->active_buffer_ = 0;
  this->bytes_received_ = 0;
  this->error_ = false;
  this->address_ = 0;
  this->byte_count_ = 0;
  WD::WD1770::set_delegate(&(this->fdc_).super_WD1770,&this->super_Delegate);
  ClockingHint::Source::set_clocking_hint_observer((Source *)&this->fdc_,&this->super_Observer);
  return;
}

Assistant:

DMAController::DMAController() {
	fdc_.set_delegate(this);
	fdc_.set_clocking_hint_observer(this);
}